

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_stam(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  uintptr_t o_2;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i64 local_38;
  TCGTemp *local_30;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_r1,FLD_C_b1);
  pTVar2 = tcg_const_i32_s390x(tcg_ctx,iVar1);
  iVar1 = get_field1(s,FLD_O_r3,FLD_C_i3);
  pTVar3 = tcg_const_i32_s390x(tcg_ctx,iVar1);
  local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_38 = o->in2 + (long)tcg_ctx;
  local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  local_30 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
  tcg_gen_callN_s390x(tcg_ctx,helper_stam,(TCGTemp *)0x0,4,&local_48);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_stam(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 r1 = tcg_const_i32(tcg_ctx, get_field(s, r1));
    TCGv_i32 r3 = tcg_const_i32(tcg_ctx, get_field(s, r3));
    gen_helper_stam(tcg_ctx, tcg_ctx->cpu_env, r1, o->in2, r3);
    tcg_temp_free_i32(tcg_ctx, r1);
    tcg_temp_free_i32(tcg_ctx, r3);
    return DISAS_NEXT;
}